

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall
helics::FederateState::getMessageDestinations
          (vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           *__return_storage_ptr__,FederateState *this,InterfaceHandle handle)

{
  EndpointInfo *pEVar1;
  
  sleeplock(this);
  pEVar1 = InterfaceInfo::getEndpoint(&this->interfaceInformation,handle);
  if (pEVar1 == (EndpointInfo *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::
    vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::vector(__return_storage_ptr__,&pEVar1->targets);
  }
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<GlobalHandle, std::string_view>>
    FederateState::getMessageDestinations(InterfaceHandle handle)
{
    const std::lock_guard<FederateState> fedlock(*this);
    const auto* eptInfo = interfaceInformation.getEndpoint(handle);
    if (eptInfo != nullptr) {
        return eptInfo->getTargets();
    }
    return {};
}